

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::InternalMetadata::Swap<google::protobuf::UnknownFieldSet>
          (InternalMetadata *this,InternalMetadata *other)

{
  UnknownFieldSet *other_00;
  
  if (((this->ptr_ & 1) == 0) && ((other->ptr_ & 1) == 0)) {
    return;
  }
  other_00 = mutable_unknown_fields<google::protobuf::UnknownFieldSet>(other);
  DoSwap<google::protobuf::UnknownFieldSet>(this,other_00);
  return;
}

Assistant:

PROTOBUF_NDEBUG_INLINE void Swap(InternalMetadata* other) {
    // Semantics here are that we swap only the unknown fields, not the arena
    // pointer. We cannot simply swap ptr_ with other->ptr_ because we need to
    // maintain our own arena ptr. Also, our ptr_ and other's ptr_ may be in
    // different states (direct arena pointer vs. container with UFS) so we
    // cannot simply swap ptr_ and then restore the arena pointers. We reuse
    // UFS's swap implementation instead.
    if (have_unknown_fields() || other->have_unknown_fields()) {
      DoSwap<T>(other->mutable_unknown_fields<T>());
    }
  }